

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O3

Matrix<float,_4,_4> * tcu::transpose<float,4,4>(Matrix<float,_4,_4> *mat)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  int row;
  Matrix<float,_4,_4> *res;
  float *in_RDI;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = in_RDI;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar5 != 4);
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)(mat->m_data).m_data[1].m_data + lVar3);
    fVar2 = *(float *)((long)(mat->m_data).m_data[2].m_data + lVar3);
    uVar7 = *(undefined4 *)((long)(mat->m_data).m_data[3].m_data + lVar3);
    pfVar4 = in_RDI + lVar3;
    *pfVar4 = *(float *)((long)(mat->m_data).m_data[0].m_data + lVar3);
    pfVar4[1] = fVar1;
    pfVar4[2] = fVar2;
    pfVar4[3] = (float)uVar7;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  return (Matrix<float,_4,_4> *)in_RDI;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}